

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O3

void slang::ast::addSubroutineDrivers(Symbol *procedure,SubroutineSymbol *sub,Expression *callExpr)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  Statement *this;
  ulong hash;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  visitedSubs;
  DriverVisitor visitor;
  StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL> local_160;
  char local_158;
  char cStack_157;
  char cStack_156;
  byte bStack_155;
  char cStack_154;
  char cStack_153;
  char cStack_152;
  byte bStack_151;
  char cStack_150;
  char cStack_14f;
  char cStack_14e;
  byte bStack_14d;
  char cStack_14c;
  char cStack_14b;
  char cStack_14a;
  byte bStack_149;
  undefined1 local_148 [40];
  Symbol *local_120;
  undefined8 local_118;
  long local_110;
  undefined1 *local_108;
  SubroutineSymbol **ppSStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [112];
  undefined8 local_78;
  long local_70;
  undefined1 *local_68;
  ValueSymbol **ppVStack_60;
  undefined1 local_58 [16];
  Symbol *local_48;
  
  local_118 = 0x3f;
  local_110 = 1;
  ppSStack_100 = (SubroutineSymbol **)0x0;
  local_108 = &boost::unordered::detail::foa::
               dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
               ::storage;
  local_f8 = 0;
  uStack_f0 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sub;
  hash = SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar4 = hash >> 0x3f;
  uVar1 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  uVar6 = 0;
  do {
    lVar7 = uVar4 * 0x10;
    local_158 = (&boost::unordered::detail::foa::
                  dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                  ::storage)[lVar7];
    cStack_157 = (&DAT_004619b1)[lVar7];
    cStack_156 = (&DAT_004619b2)[lVar7];
    bStack_155 = (&DAT_004619b3)[lVar7];
    cStack_154 = (&UNK_004619b4)[lVar7];
    cStack_153 = (&DAT_004619b5)[lVar7];
    cStack_152 = (&UNK_004619b6)[lVar7];
    bStack_151 = (&UNK_004619b7)[lVar7];
    cStack_150 = (&UNK_004619b8)[lVar7];
    cStack_14f = (&UNK_004619b9)[lVar7];
    cStack_14e = (&UNK_004619ba)[lVar7];
    bStack_14d = (&UNK_004619bb)[lVar7];
    cStack_14c = (&UNK_004619bc)[lVar7];
    cStack_14b = (&UNK_004619bd)[lVar7];
    cStack_14a = (&UNK_004619be)[lVar7];
    bStack_149 = (&DAT_004619bf)[lVar7];
    cVar8 = (char)uVar1;
    auVar12[0] = -(local_158 == cVar8);
    cVar9 = (char)((uint)uVar1 >> 8);
    auVar12[1] = -(cStack_157 == cVar9);
    cVar10 = (char)((uint)uVar1 >> 0x10);
    auVar12[2] = -(cStack_156 == cVar10);
    bVar11 = (byte)((uint)uVar1 >> 0x18);
    auVar12[3] = -(bStack_155 == bVar11);
    auVar12[4] = -(cStack_154 == cVar8);
    auVar12[5] = -(cStack_153 == cVar9);
    auVar12[6] = -(cStack_152 == cVar10);
    auVar12[7] = -(bStack_151 == bVar11);
    auVar12[8] = -(cStack_150 == cVar8);
    auVar12[9] = -(cStack_14f == cVar9);
    auVar12[10] = -(cStack_14e == cVar10);
    auVar12[0xb] = -(bStack_14d == bVar11);
    auVar12[0xc] = -(cStack_14c == cVar8);
    auVar12[0xd] = -(cStack_14b == cVar9);
    auVar12[0xe] = -(cStack_14a == cVar10);
    auVar12[0xf] = -(bStack_149 == bVar11);
    uVar5 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe);
    local_148._32_8_ = (Symbol *)local_148;
    local_120 = (Symbol *)local_148;
    if (uVar5 != 0) {
      do {
        uVar2 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        local_160.storage = (Storage *)sub;
        if (*(SubroutineSymbol **)(uVar4 * 0x78 + (ulong)uVar2 * 8) == sub) goto LAB_00374e2a;
        uVar5 = uVar5 - 1 & uVar5;
      } while (uVar5 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_149) == 0) break;
    uVar6 = uVar6 + 1;
    uVar4 = (ulong)((int)uVar4 + (int)uVar6 & 1);
  } while (uVar6 < 2);
  local_160.storage = (Storage *)sub;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
  ::unchecked_emplace_with_rehash<slang::ast::SubroutineSymbol_const*>
            ((locator *)local_e8,
             (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
              *)&local_120,hash,(SubroutineSymbol **)&local_160);
LAB_00374e2a:
  local_e8._96_8_ = local_e8 + 0x20;
  local_78 = 0x3f;
  local_70 = 1;
  local_68 = &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
  ppVStack_60 = (ValueSymbol **)0x0;
  local_58 = (undefined1  [16])0x0;
  local_e8._0_8_ = procedure;
  local_e8._8_8_ = sub;
  local_e8._16_8_ = callExpr;
  local_e8._104_8_ = local_e8._96_8_;
  local_48 = (Symbol *)local_148;
  this = SubroutineSymbol::getBody(sub);
  Statement::visit<slang::ast::DriverVisitor&>(this,(DriverVisitor *)local_e8);
  local_160.storage = (Storage *)local_e8._104_8_;
  if (ppVStack_60 != (ValueSymbol **)0x0) {
    slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>::deallocate
              (&local_160,ppVStack_60,local_70 * 0x88 + 0x96U >> 3);
  }
  local_e8._0_8_ = local_120;
  if (ppSStack_100 != (SubroutineSymbol **)0x0) {
    slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>::
    deallocate((StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL> *)local_e8,
               ppSStack_100,local_110 * 0x88 + 0x96U >> 3);
  }
  return;
}

Assistant:

static void addSubroutineDrivers(const Symbol& procedure, const SubroutineSymbol& sub,
                                 const Expression& callExpr) {
    SmallSet<const SubroutineSymbol*, 4> visitedSubs;
    visitedSubs.emplace(&sub);

    DriverVisitor visitor(procedure, visitedSubs, sub, callExpr);
    sub.getBody().visit(visitor);
}